

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O2

void FindCircularDependencies
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                *components)

{
  __node_base *p_Var1;
  vector<Component_*,_std::allocator<Component_*>_> stack;
  size_t index;
  _Vector_base<Component_*,_std::allocator<Component_*>_> local_38;
  size_t local_20;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20 = 1;
  p_Var1 = &(components->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (((Component *)p_Var1[5]._M_nxt)->index == 0) {
      StrongConnect((vector<Component_*,_std::allocator<Component_*>_> *)&local_38,&local_20,
                    (Component *)p_Var1[5]._M_nxt);
    }
  }
  std::_Vector_base<Component_*,_std::allocator<Component_*>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void FindCircularDependencies(std::unordered_map<std::string, Component *> &components) {
    std::vector<Component*> stack;
    size_t index = 1;
    for (auto &c : components) {
        if (c.second->index == 0) {
            StrongConnect(stack, index, c.second);
        }
    }
}